

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void finishCcall(lua_State *L,int status)

{
  CallInfo *ci;
  int nres;
  
  ci = L->ci;
  if ((ci->callstatus & 0x10) != 0) {
    ci->callstatus = ci->callstatus & 0xffef;
    L->errfunc = (ptrdiff_t)(ci->u).l.savedpc;
  }
  if ((ci->nresults == -1) && (ci->top < L->top)) {
    ci->top = L->top;
  }
  nres = (*(ci->u).c.k)(L,status,(ci->u).c.ctx);
  luaD_poscall(L,ci,L->top + -(long)nres,nres);
  return;
}

Assistant:

static void finishCcall (lua_State *L, int status) {
  CallInfo *ci = L->ci;
  int n;
  /* must have a continuation and must be able to call it */
  lua_assert(ci->u.c.k != NULL && yieldable(L));
  /* error status can only happen in a protected call */
  lua_assert((ci->callstatus & CIST_YPCALL) || status == LUA_YIELD);
  if (ci->callstatus & CIST_YPCALL) {  /* was inside a pcall? */
    ci->callstatus &= ~CIST_YPCALL;  /* continuation is also inside it */
    L->errfunc = ci->u.c.old_errfunc;  /* with the same error function */
  }
  /* finish 'lua_callk'/'lua_pcall'; CIST_YPCALL and 'errfunc' already
     handled */
  adjustresults(L, ci->nresults);
  lua_unlock(L);
  n = (*ci->u.c.k)(L, status, ci->u.c.ctx);  /* call continuation function */
  lua_lock(L);
  api_checknelems(L, n);
  luaD_poscall(L, ci, n);  /* finish 'luaD_call' */
}